

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O1

void __thiscall
adios2::query::BlockIndex<int>::RunStatBlocksInfo
          (BlockIndex<int> *this,QueryVar *query,size_t currStep,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  Dims *start;
  Dims *count;
  long lVar1;
  Box<Dims> *pBVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  Box<adios2::Dims> box;
  BlockHit tmp;
  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
  varBlocksInfo;
  Box<Dims> local_d8;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *local_a8;
  BlockIndex<int> *local_a0;
  BlockDivisionInfo *local_98;
  pointer local_90;
  undefined1 local_88 [40];
  pointer local_60;
  BlockHit local_50;
  
  local_a0 = this;
  core::Engine::BlocksInfo<int>
            ((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
              *)(local_88 + 0x20),this->m_IdxReader,this->m_VarPtr,currStep);
  local_90 = local_60;
  if ((pointer)local_88._32_8_ != local_60) {
    puVar8 = (pointer)local_88._32_8_;
    local_a8 = hitBlocks;
    do {
      bVar3 = RangeTree::CheckInterval<int>
                        (&query->m_RangeTree,(int *)(puVar8 + 0x1d),(int *)((long)puVar8 + 0xec));
      if (bVar3) {
        if ((local_a0->m_VarPtr->super_VariableBase).m_ShapeID == LocalArray) {
          BlockHit::BlockHit((BlockHit *)&local_d8,puVar8[0x1b]);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
          emplace_back<adios2::query::BlockHit>(hitBlocks,(BlockHit *)&local_d8);
          pBVar2 = &local_d8;
        }
        else {
          start = (Dims *)(puVar8 + 9);
          count = (Dims *)(puVar8 + 0xc);
          bVar3 = QueryVar::TouchSelection(query,start,count);
          if (!bVar3) goto LAB_0063431c;
          BlockHit::BlockHit((BlockHit *)local_88,puVar8[0x1b]);
          if (puVar8[0x20] == puVar8[0x1f]) {
LAB_00634298:
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                      (&local_d8,start,count);
            BlockHit::BlockHit(&local_50,puVar8[0x1b],&local_d8);
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
            emplace_back<adios2::query::BlockHit>(hitBlocks,&local_50);
            std::
            vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~vector(&local_50.m_Regions);
            if (local_d8.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d8.second.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_d8.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d8.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            local_98 = (BlockDivisionInfo *)(puVar8 + 0x22);
            helper::CalculateSubblockInfo(count,local_98);
            uVar5 = puVar8[0x20] - puVar8[0x1f] >> 3;
            if ((int)uVar5 == 0) goto LAB_00634298;
            bVar3 = true;
            uVar10 = 0;
            do {
              uVar6 = (ulong)((uint)uVar10 * 2);
              bVar4 = RangeTree::CheckInterval<int>
                                (&query->m_RangeTree,(int *)(puVar8[0x1f] + uVar6 * 4),
                                 (int *)(puVar8[0x1f] + (uVar6 + 1) * 4));
              if (bVar4) {
                helper::GetSubBlock(&local_d8,count,local_98,(uint)uVar10);
                if (puVar8[0xd] - puVar8[0xc] != 0) {
                  lVar7 = (long)(puVar8[0xd] - puVar8[0xc]) >> 3;
                  lVar1 = *(long *)&start->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ;
                  lVar9 = 0;
                  do {
                    local_d8.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9] =
                         local_d8.first.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9] + *(long *)(lVar1 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
                }
                bVar4 = QueryVar::TouchSelection(query,&local_d8.first,&local_d8.second);
                if (bVar4) {
                  std::
                  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::push_back((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               *)(local_88 + 8),&local_d8);
                }
                if (local_d8.second.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.second.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.first.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                bVar3 = false;
              }
              hitBlocks = local_a8;
              uVar10 = uVar10 + 1;
            } while (uVar10 != (uVar5 & 0xffffffff));
            if (bVar3) goto LAB_00634298;
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
            push_back(local_a8,(value_type *)local_88);
          }
          pBVar2 = (Box<Dims> *)local_88;
        }
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)((long)&(pBVar2->first).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8));
      }
LAB_0063431c:
      puVar8 = puVar8 + 0x33;
    } while (puVar8 != local_90);
  }
  std::
  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
  ::~vector((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
             *)(local_88 + 0x20));
  return;
}

Assistant:

void RunStatBlocksInfo(const QueryVar &query, const size_t currStep,
                           std::vector<BlockHit> &hitBlocks)
    {
        std::vector<typename adios2::core::Variable<T>::BPInfo> varBlocksInfo =
            m_IdxReader.BlocksInfo(*m_VarPtr, currStep);

        for (auto &blockInfo : varBlocksInfo)
        {
            bool isHit = query.m_RangeTree.CheckInterval(blockInfo.Min, blockInfo.Max);
            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID == adios2::ShapeID::LocalArray)
            {
                if (isHit)
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
            else
            {
                // global array
                if (!query.TouchSelection(blockInfo.Start, blockInfo.Count))
                    continue;

                BlockHit tmp(blockInfo.BlockID);
                if (blockInfo.MinMaxs.size() > 0)
                {
                    // Consolidate to whole block If all subblocks are hits, then return the whole
                    // block
                    bool allCovered = true;

                    adios2::helper::CalculateSubblockInfo(blockInfo.Count, blockInfo.SubBlockInfo);
                    unsigned int numSubBlocks =
                        static_cast<unsigned int>(blockInfo.MinMaxs.size() / 2);
                    for (unsigned int i = 0; i < numSubBlocks; i++)
                    {
                        bool isSubblockHit = query.m_RangeTree.CheckInterval(
                            blockInfo.MinMaxs[2 * i], blockInfo.MinMaxs[2 * i + 1]);
                        if (isSubblockHit)
                        {
                            adios2::Box<adios2::Dims> currSubBlock = adios2::helper::GetSubBlock(
                                blockInfo.Count, blockInfo.SubBlockInfo, i);
                            for (size_t d = 0; d < blockInfo.Count.size(); ++d)
                                currSubBlock.first[d] += blockInfo.Start[d];

                            if (!query.TouchSelection(currSubBlock.first, currSubBlock.second))
                                continue;
                            tmp.m_Regions.push_back(currSubBlock);
                        }
                        else
                        {
                            allCovered = false;
                        }
                    } // for num subblocks

                    if (!allCovered)
                    {
                        hitBlocks.push_back(tmp);
                        continue;
                    }
                }

                // no subblock info or (allCovered = true)
                adios2::Box<adios2::Dims> box = {blockInfo.Start, blockInfo.Count};
                hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
            }
        }
    }